

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O0

light_option light_create_option(uint16_t option_code,uint16_t option_length,void *option_value)

{
  light_option p_Var1;
  uint32_t *puVar2;
  void *in_RDX;
  ushort in_SI;
  uint16_t in_DI;
  light_option option;
  uint16_t size;
  ulong local_28;
  
  p_Var1 = (light_option)calloc(1,0x18);
  if ((in_SI & 3) == 0) {
    local_28 = (ulong)in_SI;
  }
  else {
    local_28 = ((ulong)(in_SI >> 2) + 1) * 4;
  }
  p_Var1->custom_option_code = in_DI;
  p_Var1->option_length = in_SI;
  puVar2 = (uint32_t *)calloc(local_28 & 0xffff,1);
  p_Var1->data = puVar2;
  memcpy(p_Var1->data,in_RDX,(ulong)in_SI);
  return p_Var1;
}

Assistant:

light_option light_create_option(const uint16_t option_code, uint16_t option_length, void *option_value)
{
	uint16_t size = 0;
	light_option option = calloc(1, sizeof(struct _light_option));

	PADD32(option_length, &size);
	option->custom_option_code = option_code;
	option->option_length = option_length;

	option->data = calloc(size, sizeof(uint8_t));
	memcpy(option->data, option_value, option_length);

	return option;
}